

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCTRLQueryExtension(Display *dpy,int *event_basep,int *error_basep)

{
  XExtDisplayInfo *pXVar1;
  int *in_RDX;
  int *in_RSI;
  XExtDisplayInfo *info;
  Display *in_stack_ffffffffffffffd8;
  int local_4;
  
  pXVar1 = find_display(in_stack_ffffffffffffffd8);
  if ((pXVar1 == (XExtDisplayInfo *)0x0) || (pXVar1->codes == (XExtCodes *)0x0)) {
    local_4 = 0;
  }
  else {
    if (in_RSI != (int *)0x0) {
      *in_RSI = pXVar1->codes->first_event;
    }
    if (in_RDX != (int *)0x0) {
      *in_RDX = pXVar1->codes->first_error;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

Bool XNVCTRLQueryExtension (
    Display *dpy,
    int *event_basep,
    int *error_basep
){
    XExtDisplayInfo *info = find_display (dpy);

    if (XextHasExtension(info)) {
        if (event_basep) *event_basep = info->codes->first_event;
        if (error_basep) *error_basep = info->codes->first_error;
        return True;
    } else {
        return False;
    }
}